

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O2

cram_index * cram_index_query(cram_fd *fd,int refid,int pos,cram_index *from)

{
  cram_index *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  cram_index *pcVar7;
  uint uVar8;
  
  if (-2 < refid) {
    uVar4 = refid + 1;
    uVar8 = 0;
    if ((int)uVar4 < fd->index_sz) {
      uVar6 = fd->index[uVar4].nslice - 1;
      pcVar7 = fd->index + uVar4;
      if (from != (cram_index *)0x0) {
        pcVar7 = from;
      }
      pcVar1 = pcVar7->e;
      uVar5 = (long)(int)uVar6 / 2 & 0xffffffff;
      while (uVar4 = (uint)uVar5, uVar4 != uVar8) {
        uVar2 = uVar8;
        uVar3 = uVar4;
        if (((pcVar1[(int)uVar4].refid <= refid) &&
            (uVar2 = uVar4, uVar3 = uVar6, refid <= pcVar1[(int)uVar4].refid)) &&
           (uVar2 = uVar8, uVar3 = uVar4, pcVar1[(int)uVar4].start < pos)) {
          uVar2 = uVar4;
          uVar3 = uVar6;
        }
        uVar6 = uVar3;
        uVar8 = uVar2;
        uVar5 = (ulong)((int)(uVar6 - uVar8) / 2 + uVar8);
      }
      if ((pcVar1[(int)uVar6].start < pos) && (pcVar1[(int)uVar6].refid == refid)) {
        uVar8 = uVar6;
      }
      uVar4 = (int)uVar8 >> 0x1f & uVar8;
      while ((uVar6 = uVar4, 0 < (int)uVar8 && (uVar6 = uVar8, pos <= pcVar1[(ulong)uVar8 - 1].end))
            ) {
        uVar8 = uVar8 - 1;
      }
      uVar8 = uVar6 + 1;
      if ((((int)uVar8 < pcVar7->nslice) && (pcVar1[(int)uVar8].start == pos)) &&
         (pcVar1[(int)uVar8].refid == refid)) {
        uVar6 = uVar8;
      }
      return pcVar1 + (int)uVar6;
    }
  }
  return (cram_index *)0x0;
}

Assistant:

cram_index *cram_index_query(cram_fd *fd, int refid, int pos, 
			     cram_index *from) {
    int i, j, k;
    cram_index *e;

    if (refid+1 < 0 || refid+1 >= fd->index_sz)
	return NULL;

    i = 0, j = fd->index[refid+1].nslice-1;

    if (!from)
	from = &fd->index[refid+1];

    for (k = j/2; k != i; k = (j-i)/2 + i) {
	if (from->e[k].refid > refid) {
	    j = k;
	    continue;
	}

	if (from->e[k].refid < refid) {
	    i = k;
	    continue;
	}

	if (from->e[k].start >= pos) {
	    j = k;
	    continue;
	}

	if (from->e[k].start < pos) {
	    i = k;
	    continue;
	}
    }
    // i==j or i==j-1. Check if j is better.
    if (from->e[j].start < pos && from->e[j].refid == refid)
	i = j;

    /* The above found *a* bin overlapping, but not necessarily the first */
    while (i > 0 && from->e[i-1].end >= pos)
	i--;

    /* Special case for matching a start pos */
    if (i+1 < from->nslice &&
	from->e[i+1].start == pos &&
	from->e[i+1].refid == refid)
	i++;

    e = &from->e[i];

    return e;
}